

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O3

void __thiscall RasterizerAGG::RasterizerAGG(RasterizerAGG *this,Image *dst,uint32_t options)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  rbuf_type *prVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 in_XMM6 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  
  Rasterizer::Rasterizer(&this->super_Rasterizer,dst,options);
  (this->super_Rasterizer)._vptr_Rasterizer = (_func_int **)&PTR__RasterizerAGG_00131d78;
  puVar5 = dst->_data;
  uVar3 = dst->_width;
  uVar4 = dst->_height;
  iVar21 = (int)dst->_stride;
  (this->_rbuf).m_start = puVar5;
  (this->_rbuf).m_buf = puVar5;
  (this->_rbuf).m_width = uVar3;
  (this->_rbuf).m_height = uVar4;
  (this->_rbuf).m_stride = iVar21;
  iVar9 = uVar4 - 1;
  if (iVar21 < 0) {
    (this->_rbuf).m_start = puVar5 + -(long)(iVar21 * iVar9);
  }
  (this->_pixfmt).m_rbuf = &this->_rbuf;
  (this->_baseRenderer).m_ren = &this->_pixfmt;
  (this->_baseRenderer).m_clip_box.x1 = 0;
  (this->_baseRenderer).m_clip_box.y1 = 0;
  (this->_baseRenderer).m_clip_box.x2 = uVar3 - 1;
  (this->_baseRenderer).m_clip_box.y2 = iVar9;
  (this->_solidRenderer).m_ren = &this->_baseRenderer;
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::rasterizer_scanline_aa
            (&this->_rasterizer);
  (this->_scanline).m_last_x = 0x7ffffff0;
  lVar10 = 0;
  (this->_scanline).m_covers.m_array = (uchar *)0x0;
  (this->_scanline).m_covers.m_size = 0;
  (this->_scanline).m_cur_span = (span *)0x0;
  (this->_scanline).m_cover_ptr = (cover_type *)0x0;
  (this->_scanline).m_spans.m_array = (span *)0x0;
  (this->_scanline).m_spans.m_size = 0;
  builtin_strncpy((this->super_Rasterizer)._name,"AGG",4);
  Rasterizer::addOptionsToName(&this->super_Rasterizer);
  auVar8 = _DAT_0011d9b0;
  auVar7 = _DAT_0011d9a0;
  auVar12 = pmovsxbd(in_XMM5,0x4040404);
  auVar11 = _DAT_0011d990;
  do {
    auVar17._4_4_ = 0;
    auVar17._0_4_ = auVar11._8_4_;
    auVar17._8_4_ = auVar11._12_4_;
    auVar17._12_4_ = 0;
    auVar18._0_8_ = SUB168(auVar17 | auVar7,0) - auVar7._0_8_;
    auVar18._8_8_ = SUB168(auVar17 | auVar7,8) - auVar7._8_8_;
    auVar14 = pmovzxdq(in_XMM6,auVar11);
    auVar19._0_8_ = SUB168(auVar14 | auVar7,0) - auVar7._0_8_;
    auVar19._8_8_ = SUB168(auVar14 | auVar7,8) - auVar7._8_8_;
    auVar14 = divpd(auVar19,auVar8);
    auVar19 = divpd(auVar18,auVar8);
    dVar13 = auVar14._0_8_ * auVar8._0_8_ + 0.5;
    dVar15 = auVar14._8_8_ * auVar8._8_8_ + 0.5;
    dVar16 = auVar19._0_8_ * auVar8._0_8_ + 0.5;
    dVar20 = auVar19._8_8_ * auVar8._8_8_ + 0.5;
    iVar21 = (int)dVar16;
    iVar9 = (int)dVar20;
    iVar22 = (int)dVar13;
    iVar23 = (int)dVar15;
    in_XMM6._0_8_ =
         CONCAT44((int)(dVar15 - 2147483648.0),(int)(dVar13 - 2147483648.0)) &
         CONCAT44(iVar23 >> 0x1f,iVar22 >> 0x1f) | CONCAT44(iVar23,iVar22);
    in_XMM6._8_8_ =
         CONCAT44((int)(dVar20 - 2147483648.0),(int)(dVar16 - 2147483648.0)) &
         CONCAT44(iVar9 >> 0x1f,iVar21 >> 0x1f) | CONCAT44(iVar9,iVar21);
    *(undefined1 (*) [16])((this->_rasterizer).m_gamma + lVar10) = in_XMM6;
    lVar10 = lVar10 + 4;
    auVar14._0_4_ = auVar11._0_4_ + auVar12._0_4_;
    auVar14._4_4_ = auVar11._4_4_ + auVar12._4_4_;
    auVar14._8_4_ = auVar11._8_4_ + auVar12._8_4_;
    auVar14._12_4_ = auVar11._12_4_ + auVar12._12_4_;
    auVar11 = auVar14;
  } while (lVar10 != 0x100);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
            (&this->_rasterizer,0.0,0.0,(double)dst->_width,(double)dst->_height);
  prVar6 = ((this->_baseRenderer).m_ren)->m_rbuf;
  (this->_baseRenderer).m_clip_box.x1 = 0;
  (this->_baseRenderer).m_clip_box.y1 = 0;
  uVar1 = prVar6->m_width;
  uVar2 = prVar6->m_height;
  (this->_baseRenderer).m_clip_box.x2 = uVar1 + -1;
  (this->_baseRenderer).m_clip_box.y2 = uVar2 + -1;
  return;
}

Assistant:

RasterizerAGG::RasterizerAGG(Image& dst, uint32_t options) noexcept
  : Rasterizer(dst, options),
    _rbuf(reinterpret_cast<unsigned char*>(dst.data()), dst.width(), dst.height(), int(dst.stride())),
    _pixfmt(_rbuf),
    _baseRenderer(_pixfmt),
    _solidRenderer(_baseRenderer) {
  std::snprintf(_name, ARRAY_SIZE(_name), "AGG");
  addOptionsToName();

  _rasterizer.gamma(agg::gamma_none());
  _rasterizer.clip_box(0, 0, dst.width(), dst.height());
  _baseRenderer.reset_clipping(true);
}